

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O2

void free_cdef_bufs_conditional
               (AV1_COMMON *cm,uint16_t **colbuf,uint16_t **srcbuf,size_t *new_colbuf_size,
               size_t new_srcbuf_size)

{
  int plane;
  long lVar1;
  
  if ((cm->cdef_info).allocated_srcbuf_size != new_srcbuf_size) {
    aom_free(*srcbuf);
    *srcbuf = (uint16_t *)0x0;
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    if (new_colbuf_size[lVar1] != (cm->cdef_info).allocated_colbuf_size[lVar1]) {
      aom_free(colbuf[lVar1]);
      colbuf[lVar1] = (uint16_t *)0x0;
    }
  }
  return;
}

Assistant:

static inline void free_cdef_bufs_conditional(AV1_COMMON *const cm,
                                              uint16_t **colbuf,
                                              uint16_t **srcbuf,
                                              const size_t *new_colbuf_size,
                                              const size_t new_srcbuf_size) {
  CdefInfo *cdef_info = &cm->cdef_info;
  if (new_srcbuf_size != cdef_info->allocated_srcbuf_size) {
    aom_free(*srcbuf);
    *srcbuf = NULL;
  }
  for (int plane = 0; plane < MAX_MB_PLANE; plane++) {
    if (new_colbuf_size[plane] != cdef_info->allocated_colbuf_size[plane]) {
      aom_free(colbuf[plane]);
      colbuf[plane] = NULL;
    }
  }
}